

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeRefDerefStop(Abc_Obj_t *pNode,int fReference)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  Abc_Obj_t *pNode_00;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  bool bVar9;
  
  iVar8 = 0;
  while( true ) {
    bVar9 = fReference == 0;
    iVar6 = 0;
    pAVar7 = pNode;
    while( true ) {
      uVar1 = *(uint *)&pAVar7->field_0x14;
      iVar4 = 0;
      if (((uVar1 & 0xf) == 2) || ((uVar1 & 0xf) == 5)) goto LAB_0068675b;
      piVar2 = (pAVar7->vFanins).pArray;
      ppvVar3 = pAVar7->pNtk->vObjs->pArray;
      pNode_00 = (Abc_Obj_t *)ppvVar3[*piVar2];
      pNode = (Abc_Obj_t *)ppvVar3[piVar2[1]];
      iVar4 = 1;
      if (bVar9) break;
      if (((uVar1 >> 10 & 1) == 0) &&
         (iVar5 = (pNode_00->vFanouts).nSize, (pNode_00->vFanouts).nSize = iVar5 + 1, iVar5 == 0)) {
        iVar4 = Abc_NodeRefDerefStop(pNode_00,1);
        iVar4 = iVar4 + 1;
      }
      if (((pAVar7->field_0x15 & 8) != 0) ||
         (iVar5 = (pNode->vFanouts).nSize, (pNode->vFanouts).nSize = iVar5 + 1, iVar5 != 0))
      goto LAB_0068675b;
      iVar6 = iVar6 + iVar4;
      bVar9 = false;
      pAVar7 = pNode;
    }
    iVar5 = (pNode_00->vFanouts).nSize;
    if (iVar5 < 1) {
      __assert_fail("pNode0->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0xbf,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
    }
    if ((pNode->vFanouts).nSize < 1) {
      __assert_fail("pNode1->vFanouts.nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                    ,0xc0,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
    }
    if (((uVar1 >> 10 & 1) == 0) &&
       (iVar5 = iVar5 + -1, (pNode_00->vFanouts).nSize = iVar5, iVar5 == 0)) {
      iVar4 = Abc_NodeRefDerefStop(pNode_00,0);
      iVar4 = iVar4 + 1;
    }
    if ((pAVar7->field_0x15 & 8) != 0) break;
    piVar2 = &(pNode->vFanouts).nSize;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 != 0) break;
    iVar8 = iVar8 + iVar4 + iVar6;
    fReference = 0;
  }
LAB_0068675b:
  return iVar6 + iVar8 + iVar4;
}

Assistant:

int Abc_NodeRefDerefStop( Abc_Obj_t * pNode, int fReference )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( !Abc_ObjFaninC0(pNode) && pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( !Abc_ObjFaninC0(pNode) && --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    return Counter;
}